

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O0

void __thiscall Assignment::~Assignment(Assignment *this)

{
  Assignment *this_local;
  
  ~Assignment(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Assignment(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right) : BinaryOperator(operation, left, right) { }